

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

sptr __thiscall pstack::Context::getDwarf(Context *this,sptr *object)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  mapped_type *pmVar3;
  element_type *peVar4;
  key_type *in_RDX;
  element_type *peVar5;
  element_type *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  sptr sVar8;
  undefined1 local_21;
  
  peVar5 = object[1].super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = &(object->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount;
  peVar4 = (element_type *)p_Var1;
  if (peVar5 != (element_type *)0x0) {
    do {
      bVar7 = *(element_type **)
               ((long)&(peVar5->dynamic)._M_t._M_impl.super__Rb_tree_header._M_header + 8) <
              (in_RDX->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (!bVar7) {
        peVar4 = peVar5;
      }
      peVar5 = *(element_type **)(&(peVar5->dynamic)._M_t._M_impl.field_0x0 + (ulong)bVar7 * 8);
    } while (peVar5 != (element_type *)0x0);
  }
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  if ((peVar4 != (element_type *)p_Var1) &&
     (_Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4,
     (in_RDX->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr <
     *(element_type **)((long)&(peVar4->dynamic)._M_t._M_impl.super__Rb_tree_header._M_header + 8)))
  {
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  }
  dwarfLookups = dwarfLookups + 1;
  if (_Var6._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1) {
    std::__shared_ptr<pstack::Dwarf::Info,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pstack::Dwarf::Info>,std::shared_ptr<pstack::Elf::Object>&>
              ((__shared_ptr<pstack::Dwarf::Info,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<pstack::Dwarf::Info> *)&local_21,in_RDX);
    pmVar3 = std::
             map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
             ::operator[]((map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
                           *)object,in_RDX);
    (pmVar3->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)&(this->dwarfCache)._M_t._M_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header);
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  else {
    dwarfHits = dwarfHits + 1;
    *(_Base_ptr *)&(this->dwarfCache)._M_t._M_impl =
         *(_Base_ptr *)
          ((long)&(((element_type *)_Var6._M_pi)->dynamic)._M_t._M_impl.super__Rb_tree_header.
                  _M_header + 0x18);
    sVar2 = (((element_type *)_Var6._M_pi)->dynamic)._M_t._M_impl.super__Rb_tree_header.
            _M_node_count;
    *(size_t *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = sVar2;
    if (sVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
      }
    }
  }
  sVar8.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar8.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sptr)sVar8.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Dwarf::Info::sptr
Context::getDwarf(Elf::Object::sptr object)
{
    auto it = dwarfCache.find(object);
    dwarfLookups++;
    if (it != dwarfCache.end()) {
        dwarfHits++;
        return it->second;
    }
    auto dwarf = std::make_shared<Dwarf::Info>(object);
    dwarfCache[object] = dwarf;
    return dwarf;
}